

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O1

void __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler::
set_control_line_output(VIAPortHandler *this,Port port,Line line,bool value)

{
  Mode MVar1;
  Keyboard *pKVar2;
  
  if ((port == B) && (line == Two)) {
    pKVar2 = this->keyboard_;
    MVar1 = pKVar2->mode_;
    if (MVar1 == AwaitingEndOfCommand) {
      if (value) {
        pKVar2->mode_ = PerformingCommand;
        pKVar2->phase_ = 0;
        return;
      }
    }
    else {
      if (MVar1 == AcceptingCommand) {
        pKVar2->data_input_ = value;
        return;
      }
      if ((MVar1 == Waiting) && (!value)) {
        pKVar2->mode_ = AcceptingCommand;
        pKVar2->phase_ = 0;
        pKVar2->command_ = 0;
        return;
      }
    }
  }
  else {
    set_control_line_output();
  }
  return;
}

Assistant:

void set_control_line_output(Port port, Line line, bool value) {
					/*
						Keyboard wiring (I believe):
						CB2 = data		(input/output)
						CB1 = clock		(input)

						CA2 is used for receiving RTC interrupts.
						CA1 is used for receiving vsync.
					*/
					if(port == Port::B && line == Line::Two) {
						keyboard_.set_input(value);
					}
					else logger.error().append("Unhandled 6522 control line output: %c%d", port ? 'B' : 'A', int(line));
				}